

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

void __thiscall
pbrt::DiffuseAreaLight::DiffuseAreaLight
          (DiffuseAreaLight *this,Transform *renderFromLight,MediumInterface *mediumInterface,
          SpectrumHandle *Le,Float scale,ShapeHandle *shape,Image *im,RGBColorSpace *imageColorSpace
          ,bool twoSided,Allocator alloc)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  Allocator alloc_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  bool bVar1;
  undefined1 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Transform *this_00;
  unsigned_long *args_5;
  size_t sVar4;
  Image *in_RCX;
  long in_RDI;
  long lVar5;
  string *this_01;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  Float FVar6;
  long in_stack_00000008;
  byte in_stack_00000010;
  undefined8 in_stack_00000018;
  size_t vb;
  int va;
  ImageChannelDesc desc;
  MediumInterface *in_stack_fffffffffffffdc8;
  Transform *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  LightType in_stack_fffffffffffffddc;
  LightBase *in_stack_fffffffffffffde0;
  DenselySampledSpectrum *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf4;
  undefined1 in_stack_fffffffffffffdf5;
  undefined1 in_stack_fffffffffffffdf6;
  undefined1 in_stack_fffffffffffffdf7;
  Image *in_stack_fffffffffffffdf8;
  Image *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  char (*in_stack_fffffffffffffe18) [12];
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  undefined8 in_stack_fffffffffffffe30;
  LogLevel LVar7;
  string *file;
  string *psVar8;
  LogLevel level;
  allocator<char> *args_2;
  int *args_3;
  allocator<char> *args_4;
  undefined1 *puVar9;
  allocator<char> local_123;
  allocator<char> local_122;
  allocator<char> local_121;
  string *local_120;
  string local_118 [32];
  int local_f8 [8];
  undefined1 local_d8 [32];
  string *local_b8;
  undefined8 local_b0;
  undefined8 local_58;
  undefined1 local_50 [15];
  byte local_41;
  undefined4 local_2c;
  undefined8 local_8;
  
  LVar7 = (LogLevel)((ulong)in_stack_fffffffffffffe30 >> 0x20);
  local_8 = in_stack_00000018;
  local_41 = in_stack_00000010 & 1;
  local_2c = in_XMM0_Da;
  LightBase::LightBase
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd0,
             in_stack_fffffffffffffdc8);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x98);
  puVar9 = local_50;
  SpectrumHandle::SpectrumHandle
            ((SpectrumHandle *)in_stack_fffffffffffffdd0,(SpectrumHandle *)in_stack_fffffffffffffdc8
            );
  local_58 = local_8;
  alloc_00.memoryResource._4_1_ = in_stack_fffffffffffffdf4;
  alloc_00.memoryResource._0_4_ = in_stack_fffffffffffffdf0;
  alloc_00.memoryResource._5_1_ = in_stack_fffffffffffffdf5;
  alloc_00.memoryResource._6_1_ = in_stack_fffffffffffffdf6;
  alloc_00.memoryResource._7_1_ = in_stack_fffffffffffffdf7;
  DenselySampledSpectrum::DenselySampledSpectrum
            (in_stack_fffffffffffffde8,(SpectrumHandle *)in_stack_fffffffffffffde0,alloc_00);
  *(undefined4 *)(in_RDI + 0xc0) = local_2c;
  ShapeHandle::ShapeHandle
            ((ShapeHandle *)in_stack_fffffffffffffdd0,(ShapeHandle *)in_stack_fffffffffffffdc8);
  *(byte *)(in_RDI + 0xd0) = local_41 & 1;
  this_00 = (Transform *)(in_RDI + 0xd4);
  FVar6 = ShapeHandle::Area((ShapeHandle *)in_stack_fffffffffffffdd0);
  (this_00->m).m[0][0] = FVar6;
  *(long *)(in_RDI + 0xd8) = in_stack_00000008;
  lVar5 = in_RDI + 0xe0;
  Image::Image(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  *(long *)(in_FS_OFFSET + -0x398) = *(long *)(in_FS_OFFSET + -0x398) + 1;
  bVar1 = Image::operator_cast_to_bool((Image *)(in_RDI + 0xe0));
  FVar6 = (Float)((ulong)lVar5 >> 0x20);
  if (bVar1) {
    args_5 = (unsigned_long *)(in_RDI + 0xe0);
    local_120 = local_118;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (allocator<char> *)in_stack_fffffffffffffe00);
    args_3 = local_f8;
    args_4 = &local_122;
    local_120 = (string *)args_3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (allocator<char> *)in_stack_fffffffffffffe00);
    local_120 = (string *)local_d8;
    args_2 = &local_123;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (allocator<char> *)in_stack_fffffffffffffe00);
    local_b8 = local_118;
    local_b0 = 3;
    v._M_array._4_4_ = in_stack_fffffffffffffddc;
    v._M_array._0_4_ = in_stack_fffffffffffffdd8;
    v._M_len = (size_type)in_stack_fffffffffffffde0;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffffdd0,v);
    requestedChannels.n = (size_t)puVar9;
    requestedChannels.ptr = pbVar3;
    Image::GetChannelDesc(in_RCX,requestedChannels);
    file = local_118;
    this_01 = (string *)&local_b8;
    do {
      this_01 = this_01 + -0x20;
      std::__cxx11::string::~string(this_01);
      FVar6 = (Float)((ulong)lVar5 >> 0x20);
    } while (this_01 != file);
    psVar8 = this_01;
    std::allocator<char>::~allocator(&local_123);
    LVar7 = (LogLevel)((ulong)this_01 >> 0x20);
    level = (LogLevel)((ulong)psVar8 >> 0x20);
    std::allocator<char>::~allocator(&local_122);
    std::allocator<char>::~allocator(&local_121);
    uVar2 = ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x6f094d);
    if (!(bool)uVar2) {
      ErrorExit<>((char *)in_stack_fffffffffffffe00);
    }
    sVar4 = ImageChannelDesc::size((ImageChannelDesc *)0x6f0af7);
    if (sVar4 != 3) {
      LogFatal<char_const(&)[2],char_const(&)[12],char_const(&)[2],int&,char_const(&)[12],unsigned_long&>
                (level,(char *)file,LVar7,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe28),
                 (char (*) [2])CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 in_stack_fffffffffffffe18,(char (*) [2])args_2,args_3,(char (*) [12])args_4,args_5)
      ;
    }
    bVar1 = ImageChannelDesc::IsIdentity
                      ((ImageChannelDesc *)
                       CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    if (!bVar1) {
      LogFatal<char_const(&)[18]>
                (LVar7,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe28),in_stack_fffffffffffffe24,
                 *in_stack_fffffffffffffe18,(char (*) [18])in_stack_fffffffffffffe10);
    }
    if (in_stack_00000008 == 0) {
      LogFatal<char_const(&)[27]>
                (LVar7,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe28),in_stack_fffffffffffffe24,
                 *in_stack_fffffffffffffe18,(char (*) [27])in_stack_fffffffffffffe10);
    }
    ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x6f0bf1);
  }
  else {
    bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)in_RCX);
    if (!bVar1) {
      LogFatal<char_const(&)[3]>
                (LVar7,(char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                 in_stack_fffffffffffffe24,*in_stack_fffffffffffffe18,
                 (char (*) [3])in_stack_fffffffffffffe10);
    }
  }
  bVar1 = Transform::HasScale(this_00,FVar6);
  if (((bVar1) &&
      (bVar1 = TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
               ::Is<pbrt::Triangle>
                         ((TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
                           *)in_stack_fffffffffffffdd0), !bVar1)) &&
     (bVar1 = TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
              ::Is<pbrt::BilinearPatch>
                        ((TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
                          *)in_stack_fffffffffffffdd0), !bVar1)) {
    Warning<>((char *)in_stack_fffffffffffffe00);
  }
  return;
}

Assistant:

DiffuseAreaLight::DiffuseAreaLight(const Transform &renderFromLight,
                                   const MediumInterface &mediumInterface,
                                   SpectrumHandle Le, Float scale,
                                   const ShapeHandle shape, Image im,
                                   const RGBColorSpace *imageColorSpace, bool twoSided,
                                   Allocator alloc)
    : LightBase(LightType::Area, renderFromLight, mediumInterface),
      Lemit(Le, alloc),
      scale(scale),
      shape(shape),
      twoSided(twoSided),
      area(shape.Area()),
      imageColorSpace(imageColorSpace),
      image(std::move(im)) {
    ++numAreaLights;

    if (image) {
        ImageChannelDesc desc = image.GetChannelDesc({"R", "G", "B"});
        if (!desc)
            ErrorExit("Image used for DiffuseAreaLight doesn't have R, G, B "
                      "channels.");
        CHECK_EQ(3, desc.size());
        CHECK(desc.IsIdentity());
        CHECK(imageColorSpace != nullptr);
    } else {
        CHECK(Le);
    }

    // Warn if light has transformation with non-uniform scale, though not
    // for Triangles, since this doesn't matter for them.
    // FIXME: is this still true with animated transformations?
    if (renderFromLight.HasScale() && !shape.Is<Triangle>() && !shape.Is<BilinearPatch>())
        Warning("Scaling detected in world to light transformation! "
                "The system has numerous assumptions, implicit and explicit, "
                "that this transform will have no scale factors in it. "
                "Proceed at your own risk; your image may have errors.");
}